

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigUtil.c
# Opt level: O0

void Aig_ManRandomInfo(Vec_Ptr_t *vInfo,int iInputStart,int iWordStart,int iWordStop)

{
  int iVar1;
  uint uVar2;
  void *pvVar3;
  undefined4 local_30;
  undefined4 local_2c;
  int w;
  int i;
  uint *pInfo;
  int iWordStop_local;
  int iWordStart_local;
  int iInputStart_local;
  Vec_Ptr_t *vInfo_local;
  
  for (local_2c = iInputStart; iVar1 = Vec_PtrSize(vInfo), local_2c < iVar1; local_2c = local_2c + 1
      ) {
    pvVar3 = Vec_PtrEntry(vInfo,local_2c);
    for (local_30 = iWordStart; local_30 < iWordStop; local_30 = local_30 + 1) {
      uVar2 = Aig_ManRandom(0);
      *(uint *)((long)pvVar3 + (long)local_30 * 4) = uVar2;
    }
  }
  return;
}

Assistant:

void Aig_ManRandomInfo( Vec_Ptr_t * vInfo, int iInputStart, int iWordStart, int iWordStop )
{
    unsigned * pInfo;
    int i, w;
    Vec_PtrForEachEntryStart( unsigned *, vInfo, pInfo, i, iInputStart )
        for ( w = iWordStart; w < iWordStop; w++ )
            pInfo[w] = Aig_ManRandom(0);
}